

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O0

dsa_key_material_t * crypto_malloc_dsa(DSA *dsa)

{
  int iVar1;
  void *pvVar2;
  long in_RDI;
  BIGNUM *bn_pub_key;
  BIGNUM *bn_priv_key;
  BIGNUM *bn_g;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  dsa_key_material_t *keyMat;
  BIGNUM *local_40;
  BIGNUM *local_38;
  BIGNUM *local_30;
  BIGNUM *local_28;
  BIGNUM *local_20;
  dsa_key_material_t *local_18;
  long local_10;
  dsa_key_material_t *local_8;
  
  if (in_RDI == 0) {
    local_8 = (dsa_key_material_t *)0x0;
  }
  else {
    local_10 = in_RDI;
    local_18 = (dsa_key_material_t *)malloc(0x50);
    if (local_18 == (dsa_key_material_t *)0x0) {
      local_8 = (dsa_key_material_t *)0x0;
    }
    else {
      local_20 = (BIGNUM *)0x0;
      local_28 = (BIGNUM *)0x0;
      local_30 = (BIGNUM *)0x0;
      local_38 = (BIGNUM *)0x0;
      local_40 = (BIGNUM *)0x0;
      DSA_get0_pqg(local_10,&local_20,&local_28,&local_30);
      DSA_get0_key(local_10,&local_40,&local_38);
      iVar1 = BN_num_bits(local_20);
      *(long *)local_18 = (long)((iVar1 + 7) / 8);
      iVar1 = BN_num_bits(local_28);
      *(long *)(local_18 + 8) = (long)((iVar1 + 7) / 8);
      iVar1 = BN_num_bits(local_30);
      *(long *)(local_18 + 0x10) = (long)((iVar1 + 7) / 8);
      iVar1 = BN_num_bits(local_38);
      *(long *)(local_18 + 0x18) = (long)((iVar1 + 7) / 8);
      iVar1 = BN_num_bits(local_40);
      *(long *)(local_18 + 0x20) = (long)((iVar1 + 7) / 8);
      pvVar2 = malloc(*(size_t *)local_18);
      *(void **)(local_18 + 0x28) = pvVar2;
      pvVar2 = malloc(*(size_t *)(local_18 + 8));
      *(void **)(local_18 + 0x30) = pvVar2;
      pvVar2 = malloc(*(size_t *)(local_18 + 0x10));
      *(void **)(local_18 + 0x38) = pvVar2;
      pvVar2 = malloc(*(size_t *)(local_18 + 0x18));
      *(void **)(local_18 + 0x40) = pvVar2;
      pvVar2 = malloc(*(size_t *)(local_18 + 0x20));
      *(void **)(local_18 + 0x48) = pvVar2;
      if ((((*(size_t *)(local_18 + 0x28) == 0) || (*(size_t *)(local_18 + 0x30) == 0)) ||
          (*(size_t *)(local_18 + 0x38) == 0)) ||
         ((*(size_t *)(local_18 + 0x40) == 0 || (*(size_t *)(local_18 + 0x48) == 0)))) {
        crypto_free_dsa((dsa_key_material_t *)0x11aa49);
        local_8 = (dsa_key_material_t *)0x0;
      }
      else {
        BN_bn2bin(local_20,*(uchar **)(local_18 + 0x28));
        BN_bn2bin(local_28,*(uchar **)(local_18 + 0x30));
        BN_bn2bin(local_30,*(uchar **)(local_18 + 0x38));
        BN_bn2bin(local_38,*(uchar **)(local_18 + 0x40));
        BN_bn2bin(local_40,*(uchar **)(local_18 + 0x48));
        local_8 = local_18;
      }
    }
  }
  return local_8;
}

Assistant:

dsa_key_material_t* crypto_malloc_dsa(DSA* dsa)
{
	if (dsa == NULL)
	{
		return NULL;
	}

	dsa_key_material_t* keyMat = (dsa_key_material_t*)malloc(sizeof(dsa_key_material_t));
	if (keyMat == NULL)
	{
		return NULL;
	}

	const BIGNUM* bn_p = NULL;
	const BIGNUM* bn_q = NULL;
	const BIGNUM* bn_g = NULL;
	const BIGNUM* bn_priv_key = NULL;
	const BIGNUM* bn_pub_key = NULL;
	DSA_get0_pqg(dsa, &bn_p, &bn_q, &bn_g);
	DSA_get0_key(dsa, &bn_pub_key, &bn_priv_key);

	keyMat->sizeP = BN_num_bytes(bn_p);
	keyMat->sizeQ = BN_num_bytes(bn_q);
	keyMat->sizeG = BN_num_bytes(bn_g);
	keyMat->sizeX = BN_num_bytes(bn_priv_key);
	keyMat->sizeY = BN_num_bytes(bn_pub_key);

	keyMat->bigP = (CK_VOID_PTR)malloc(keyMat->sizeP);
	keyMat->bigQ = (CK_VOID_PTR)malloc(keyMat->sizeQ);
	keyMat->bigG = (CK_VOID_PTR)malloc(keyMat->sizeG);
	keyMat->bigX = (CK_VOID_PTR)malloc(keyMat->sizeX);
	keyMat->bigY = (CK_VOID_PTR)malloc(keyMat->sizeY);

	if (!keyMat->bigP || !keyMat->bigQ || !keyMat->bigG || !keyMat->bigX || !keyMat->bigY)
	{
		crypto_free_dsa(keyMat);
		return NULL;
	}

	BN_bn2bin(bn_p, (unsigned char*)keyMat->bigP);
	BN_bn2bin(bn_q, (unsigned char*)keyMat->bigQ);
	BN_bn2bin(bn_g, (unsigned char*)keyMat->bigG);
	BN_bn2bin(bn_priv_key, (unsigned char*)keyMat->bigX);
	BN_bn2bin(bn_pub_key, (unsigned char*)keyMat->bigY);

	return keyMat;
}